

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xml_parse_file_ext2(xar *xar,char *name)

{
  int iVar1;
  xmlstatus xVar2;
  xar_file *pxVar3;
  char *p;
  
  iVar1 = strcmp(name,"SecureDeletion");
  if (iVar1 == 0) {
    p = "securedeletion";
    xVar2 = FILE_EXT2_SecureDeletion;
  }
  else {
    iVar1 = strcmp(name,"Undelete");
    if (iVar1 == 0) {
      p = "nouunlink";
      xVar2 = FILE_EXT2_Undelete;
    }
    else {
      iVar1 = strcmp(name,"Compress");
      if (iVar1 == 0) {
        p = "compress";
        xVar2 = FILE_EXT2_Compress;
      }
      else {
        iVar1 = strcmp(name,"Synchronous");
        if (iVar1 == 0) {
          p = "sync";
          xVar2 = FILE_EXT2_Synchronous;
        }
        else {
          iVar1 = strcmp(name,"Immutable");
          if (iVar1 == 0) {
            p = "simmutable";
            xVar2 = FILE_EXT2_Immutable;
          }
          else {
            iVar1 = strcmp(name,"AppendOnly");
            if (iVar1 == 0) {
              p = "sappend";
              xVar2 = FILE_EXT2_AppendOnly;
            }
            else {
              iVar1 = strcmp(name,"NoDump");
              if (iVar1 == 0) {
                p = "nodump";
                xVar2 = FILE_EXT2_NoDump;
              }
              else {
                iVar1 = strcmp(name,"NoAtime");
                if (iVar1 == 0) {
                  p = "noatime";
                  xVar2 = FILE_EXT2_NoAtime;
                }
                else {
                  iVar1 = strcmp(name,"CompDirty");
                  if (iVar1 == 0) {
                    p = "compdirty";
                    xVar2 = FILE_EXT2_CompDirty;
                  }
                  else {
                    iVar1 = strcmp(name,"CompBlock");
                    if (iVar1 == 0) {
                      p = "comprblk";
                      xVar2 = FILE_EXT2_CompBlock;
                    }
                    else {
                      iVar1 = strcmp(name,"NoCompBlock");
                      if (iVar1 == 0) {
                        p = "nocomprblk";
                        xVar2 = FILE_EXT2_NoCompBlock;
                      }
                      else {
                        iVar1 = strcmp(name,"CompError");
                        if (iVar1 == 0) {
                          p = "comperr";
                          xVar2 = FILE_EXT2_CompError;
                        }
                        else {
                          iVar1 = strcmp(name,"BTree");
                          if (iVar1 == 0) {
                            p = "btree";
                            xVar2 = FILE_EXT2_BTree;
                          }
                          else {
                            iVar1 = strcmp(name,"HashIndexed");
                            if (iVar1 == 0) {
                              p = "hashidx";
                              xVar2 = FILE_EXT2_HashIndexed;
                            }
                            else {
                              iVar1 = strcmp(name,"iMagic");
                              if (iVar1 == 0) {
                                p = "imagic";
                                xVar2 = FILE_EXT2_iMagic;
                              }
                              else {
                                iVar1 = strcmp(name,"Journaled");
                                if (iVar1 == 0) {
                                  p = "journal";
                                  xVar2 = FILE_EXT2_Journaled;
                                }
                                else {
                                  iVar1 = strcmp(name,"NoTail");
                                  if (iVar1 == 0) {
                                    p = "notail";
                                    xVar2 = FILE_EXT2_NoTail;
                                  }
                                  else {
                                    iVar1 = strcmp(name,"DirSync");
                                    if (iVar1 == 0) {
                                      p = "dirsync";
                                      xVar2 = FILE_EXT2_DirSync;
                                    }
                                    else {
                                      iVar1 = strcmp(name,"TopDir");
                                      if (iVar1 == 0) {
                                        p = "topdir";
                                        xVar2 = FILE_EXT2_TopDir;
                                      }
                                      else {
                                        iVar1 = strcmp(name,"Reserved");
                                        if (iVar1 != 0) {
                                          return 0;
                                        }
                                        p = "reserved";
                                        xVar2 = FILE_EXT2_Reserved;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  xar->xmlsts = xVar2;
  pxVar3 = xar->file;
  if ((pxVar3->fflags_text).length != 0) {
    archive_strappend_char(&pxVar3->fflags_text,',');
    pxVar3 = xar->file;
  }
  archive_strcat(&pxVar3->fflags_text,p);
  return 1;
}

Assistant:

static int
xml_parse_file_ext2(struct xar *xar, const char *name)
{
	const char *flag = NULL;

	if (strcmp(name, "SecureDeletion") == 0) {
		xar->xmlsts = FILE_EXT2_SecureDeletion;
		flag = "securedeletion";
	}
	else if (strcmp(name, "Undelete") == 0) {
		xar->xmlsts = FILE_EXT2_Undelete;
		flag = "nouunlink";
	}
	else if (strcmp(name, "Compress") == 0) {
		xar->xmlsts = FILE_EXT2_Compress;
		flag = "compress";
	}
	else if (strcmp(name, "Synchronous") == 0) {
		xar->xmlsts = FILE_EXT2_Synchronous;
		flag = "sync";
	}
	else if (strcmp(name, "Immutable") == 0) {
		xar->xmlsts = FILE_EXT2_Immutable;
		flag = "simmutable";
	}
	else if (strcmp(name, "AppendOnly") == 0) {
		xar->xmlsts = FILE_EXT2_AppendOnly;
		flag = "sappend";
	}
	else if (strcmp(name, "NoDump") == 0) {
		xar->xmlsts = FILE_EXT2_NoDump;
		flag = "nodump";
	}
	else if (strcmp(name, "NoAtime") == 0) {
		xar->xmlsts = FILE_EXT2_NoAtime;
		flag = "noatime";
	}
	else if (strcmp(name, "CompDirty") == 0) {
		xar->xmlsts = FILE_EXT2_CompDirty;
		flag = "compdirty";
	}
	else if (strcmp(name, "CompBlock") == 0) {
		xar->xmlsts = FILE_EXT2_CompBlock;
		flag = "comprblk";
	}
	else if (strcmp(name, "NoCompBlock") == 0) {
		xar->xmlsts = FILE_EXT2_NoCompBlock;
		flag = "nocomprblk";
	}
	else if (strcmp(name, "CompError") == 0) {
		xar->xmlsts = FILE_EXT2_CompError;
		flag = "comperr";
	}
	else if (strcmp(name, "BTree") == 0) {
		xar->xmlsts = FILE_EXT2_BTree;
		flag = "btree";
	}
	else if (strcmp(name, "HashIndexed") == 0) {
		xar->xmlsts = FILE_EXT2_HashIndexed;
		flag = "hashidx";
	}
	else if (strcmp(name, "iMagic") == 0) {
		xar->xmlsts = FILE_EXT2_iMagic;
		flag = "imagic";
	}
	else if (strcmp(name, "Journaled") == 0) {
		xar->xmlsts = FILE_EXT2_Journaled;
		flag = "journal";
	}
	else if (strcmp(name, "NoTail") == 0) {
		xar->xmlsts = FILE_EXT2_NoTail;
		flag = "notail";
	}
	else if (strcmp(name, "DirSync") == 0) {
		xar->xmlsts = FILE_EXT2_DirSync;
		flag = "dirsync";
	}
	else if (strcmp(name, "TopDir") == 0) {
		xar->xmlsts = FILE_EXT2_TopDir;
		flag = "topdir";
	}
	else if (strcmp(name, "Reserved") == 0) {
		xar->xmlsts = FILE_EXT2_Reserved;
		flag = "reserved";
	}

	if (flag == NULL)
		return (0);
	if (archive_strlen(&(xar->file->fflags_text)) > 0)
		archive_strappend_char(&(xar->file->fflags_text), ',');
	archive_strcat(&(xar->file->fflags_text), flag);
	return (1);
}